

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::ColumnData::Checkpoint
          (ColumnData *this,RowGroup *row_group,ColumnCheckpointInfo *checkpoint_info)

{
  undefined8 uVar1;
  pointer pCVar2;
  ColumnCheckpointInfo *in_RCX;
  pointer *__ptr;
  initializer_list<std::reference_wrapper<duckdb::ColumnCheckpointState>_> __l;
  vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> states;
  ColumnDataCheckpointer checkpointer;
  allocator_type local_139;
  undefined1 local_138 [48];
  ColumnDataCheckpointer local_108;
  
  (**(code **)((row_group->super_SegmentBase<duckdb::RowGroup>).start + 0xd8))();
  LogicalType::LogicalType
            ((LogicalType *)(local_138 + 0x18),(LogicalType *)&row_group->owned_version_info);
  BaseStatistics::CreateEmpty((BaseStatistics *)&local_108,(LogicalType *)(local_138 + 0x18));
  BaseStatistics::ToUnique((BaseStatistics *)local_138);
  pCVar2 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                         *)this);
  uVar1 = local_138._0_8_;
  local_138._0_8_ = (BaseStatistics *)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
        &pCVar2->global_stats,(pointer)uVar1);
  uVar1 = local_138._0_8_;
  if ((BaseStatistics *)local_138._0_8_ != (BaseStatistics *)0x0) {
    BaseStatistics::~BaseStatistics((BaseStatistics *)local_138._0_8_);
    operator_delete((void *)uVar1);
  }
  local_138._0_8_ = (pointer)0x0;
  BaseStatistics::~BaseStatistics((BaseStatistics *)&local_108);
  LogicalType::~LogicalType((LogicalType *)(local_138 + 0x18));
  local_108.checkpoint_states =
       (vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *)
       ((long)&(row_group->row_group_lock).super___mutex_base._M_mutex + 0x18);
  local_108.db._0_1_ = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_108);
  local_108.db._0_1_ = true;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_108);
  if ((row_group->row_group_lock).super___mutex_base._M_mutex.__align !=
      *(long *)((long)&(row_group->row_group_lock).super___mutex_base._M_mutex + 8)) {
    local_108.checkpoint_states =
         (vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *)
         unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
         ::operator*((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                      *)this);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_108;
    ::std::
    vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
    ::vector((vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
              *)local_138,__l,&local_139);
    ColumnDataCheckpointer::ColumnDataCheckpointer
              (&local_108,
               (vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *)local_138,
               (DatabaseInstance *)
               ((row_group->collection)._M_data)->block_manager[1].blocks._M_h._M_element_count,
               (RowGroup *)checkpoint_info,in_RCX);
    ColumnDataCheckpointer::Checkpoint(&local_108);
    ColumnDataCheckpointer::FinalizeCheckpoint(&local_108);
    ::std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>_>_>
    ::~vector(&local_108.analyze_states.
               super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>_>_>
             );
    ::std::
    vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_std::allocator<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>_>_>
    ::~vector(&local_108.compression_functions.
               super_vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_std::allocator<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>_>_>
             );
    if (local_108.has_changes.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_108.has_changes.super_vector<bool,_std::allocator<bool>_>.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p);
      local_108.has_changes.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_108.has_changes.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_108.has_changes.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_108.has_changes.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      local_108.has_changes.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
           = (_Bit_pointer)0x0;
    }
    if (local_108.intermediate.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.intermediate.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_108.intermediate.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.intermediate.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_108.intermediate.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
        internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.intermediate.validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_108.intermediate.type);
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_);
    }
  }
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )this;
}

Assistant:

unique_ptr<ColumnCheckpointState> ColumnData::Checkpoint(RowGroup &row_group, ColumnCheckpointInfo &checkpoint_info) {
	// scan the segments of the column data
	// set up the checkpoint state
	auto checkpoint_state = CreateCheckpointState(row_group, checkpoint_info.info.manager);
	checkpoint_state->global_stats = BaseStatistics::CreateEmpty(type).ToUnique();

	auto &nodes = data.ReferenceSegments();
	if (nodes.empty()) {
		// empty table: flush the empty list
		return checkpoint_state;
	}

	vector<reference<ColumnCheckpointState>> states {*checkpoint_state};
	ColumnDataCheckpointer checkpointer(states, GetDatabase(), row_group, checkpoint_info);
	checkpointer.Checkpoint();
	checkpointer.FinalizeCheckpoint();
	return checkpoint_state;
}